

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O3

bool __thiscall TPZStructMatrixOR<double>::ThreadData::ShouldCompute(ThreadData *this,int matid)

{
  TPZStructMatrix *pTVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  pTVar1 = this->fStruct;
  if ((int)(pTVar1->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return true;
  }
  p_Var4 = (pTVar1->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(pTVar1->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var2->_M_header;
  p_Var5 = &p_Var2->_M_header;
  if (p_Var4 != (_Base_ptr)0x0) {
    do {
      if (matid <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < matid];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var2) && (p_Var5 = p_Var3, matid < (int)p_Var3[1]._M_color))
    {
      p_Var5 = &p_Var2->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var5 != p_Var2;
}

Assistant:

bool 
TPZStructMatrixOR<TVar>::ThreadData::ShouldCompute(int matid) const{
    return fStruct->ShouldCompute(matid);
}